

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5UpdateMethod(sqlite3_vtab *pVtab,int nArg,sqlite3_value **apVal,sqlite_int64 *pRowid)

{
  _func_int_sqlite3_vtab_ptr_char_ptr_char_ptr_int_char_ptr_ptr **pp_Var1;
  byte bVar2;
  uint uVar3;
  Fts5Config *pFVar4;
  Fts5Storage *pFVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  _func_int_sqlite3_vtab_cursor_ptr_sqlite3_context_ptr_int *p_Var9;
  char *pcVar10;
  long lVar11;
  Fts5Structure *pFVar12;
  Fts5Structure *pFVar13;
  Mem *pMVar14;
  i64 iVar15;
  sqlite3_value *psVar16;
  uchar *puVar17;
  Fts5Config *pFVar18;
  i64 iVar19;
  int iVar20;
  long lVar21;
  uint uVar22;
  Fts5Index *pFVar23;
  sqlite3_stmt *pStmt;
  long in_FS_OFFSET;
  bool bVar24;
  int rc;
  int nLoc;
  char *pText;
  int nText;
  sqlite3_stmt *pScan;
  Fts5Buffer buf;
  int local_88;
  int local_84;
  uchar *local_80;
  int local_74;
  char *local_70;
  int local_68;
  int local_64;
  Fts5Storage *local_60;
  undefined8 local_58;
  sqlite3_stmt *local_50;
  Fts5Buffer local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar4 = (Fts5Config *)pVtab[1].pModule;
  local_88 = 0;
  pFVar18 = pFVar4;
  if (pFVar4->pgsz == 0) {
    local_88 = sqlite3Fts5ConfigLoad(pFVar4,pFVar4->iCookie);
    if (local_88 != 0) goto LAB_001d941f;
    pFVar18 = (Fts5Config *)pVtab[1].pModule;
  }
  pFVar18->pzErrmsg = &pVtab->zErrMsg;
  for (p_Var9 = (pVtab[2].pModule)->xColumn;
      p_Var9 != (_func_int_sqlite3_vtab_cursor_ptr_sqlite3_context_ptr_int *)0x0;
      p_Var9 = *(_func_int_sqlite3_vtab_cursor_ptr_sqlite3_context_ptr_int **)(p_Var9 + 8)) {
    if ((*(int *)(p_Var9 + 0x20) == 1) && (*(sqlite3_vtab **)p_Var9 == pVtab)) {
      p_Var9[0x50] = (_func_int_sqlite3_vtab_cursor_ptr_sqlite3_context_ptr_int)
                     ((byte)p_Var9[0x50] | 0x20);
    }
  }
  uVar22 = (*apVal)->flags & 0x3f;
  if (((0xaaaaaaaaaaaaaaaaU >> uVar22 & 1) == 0) ||
     (psVar16 = apVal[(long)pFVar4->nCol + 2], uVar3._0_2_ = psVar16->flags,
     uVar3._2_1_ = psVar16->enc, uVar3._3_1_ = psVar16->eSubtype,
     (0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
    if ((pFVar4->eContent == 0) || (pFVar4->bContentlessDelete != 0)) {
      bVar24 = pFVar4->db->vtabOnConflict == '\x05';
    }
    else {
      bVar24 = false;
    }
    if (nArg == 1) {
      if (((pFVar18->eContent & 0xfffffffdU) == 1) && (pFVar4->bContentlessDelete == 0)) {
        fts5SetVtabError((Fts5FullTable *)pVtab,"cannot DELETE from contentless fts5 table: %s",
                         pFVar4->zName);
        goto LAB_001d9281;
      }
      iVar15 = sqlite3VdbeIntValue(*apVal);
      iVar7 = sqlite3Fts5StorageDelete
                        ((Fts5Storage *)pVtab[1].zErrMsg,iVar15,(sqlite3_value **)0x0,0);
    }
    else {
      iVar7 = sqlite3_value_numeric_type(apVal[1]);
      if ((pFVar4->bLocale == 0) && (0 < pFVar4->nCol)) {
        lVar11 = 0;
        do {
          iVar8 = sqlite3Fts5IsLocaleValue(pFVar4,apVal[lVar11 + 2]);
          if (iVar8 != 0) {
            fts5SetVtabError((Fts5FullTable *)pVtab,"fts5_locale() requires locale=1");
            local_88 = 0x14;
            iVar7 = local_88;
            goto LAB_001d940c;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < pFVar4->nCol);
      }
      if ((0x50505050UL >> uVar22 & 1) == 0) {
        if ((bool)(bVar24 & iVar7 == 1)) {
          iVar15 = sqlite3VdbeIntValue(apVal[1]);
          local_88 = sqlite3Fts5StorageDelete
                               ((Fts5Storage *)pVtab[1].zErrMsg,iVar15,(sqlite3_value **)0x0,0);
        }
        fts5StorageInsert(&local_88,(Fts5FullTable *)pVtab,apVal,pRowid);
        iVar7 = local_88;
      }
      else {
        pFVar5 = (Fts5Storage *)pVtab[1].zErrMsg;
        iVar15 = sqlite3VdbeIntValue(*apVal);
        iVar19 = sqlite3VdbeIntValue(apVal[1]);
        bVar6 = true;
        if (((ulong)(pVtab[1].pModule)->xNext & 0xfffffffd) == 1) {
          if ((long)pFVar4->nCol < 1) {
            if (iVar15 != iVar19) {
LAB_001d925c:
              bVar6 = true;
              if (pFVar4->bContentlessDelete == 0) {
                pcVar10 = "%s contentless fts5 table: %s";
                goto LAB_001d926b;
              }
              goto LAB_001d9291;
            }
          }
          else {
            lVar11 = 0;
            iVar20 = 0;
            iVar8 = 0;
            do {
              if (pFVar4->abUnindexed[lVar11] == '\0') {
                psVar16 = apVal[lVar11 + 2];
                uVar22._0_2_ = psVar16->flags;
                uVar22._2_1_ = psVar16->enc;
                uVar22._3_1_ = psVar16->eSubtype;
                if ((~uVar22 & 0x401) == 0) {
                  iVar20 = iVar20 + 1;
                }
                else {
                  iVar8 = iVar8 + 1;
                }
              }
              lVar11 = lVar11 + 1;
            } while (pFVar4->nCol != lVar11);
            if (iVar8 != 0 || iVar15 != iVar19) {
              if (iVar20 == 0) goto LAB_001d925c;
              pcVar10 = "%s a subset of columns on fts5 contentless-delete table: %s";
              if (pFVar4->bContentlessDelete == 0) {
                pcVar10 = "%s contentless fts5 table: %s";
              }
LAB_001d926b:
              sqlite3Fts5ConfigErrmsg(pFVar4,pcVar10,"cannot UPDATE",pFVar4->zName);
              goto LAB_001d9281;
            }
          }
          bVar6 = false;
        }
LAB_001d9291:
        if (iVar7 == 1) {
          if (iVar15 == iVar19) {
            if (bVar6) {
              local_88 = sqlite3Fts5StorageDelete(pFVar5,iVar15,(sqlite3_value **)0x0,1);
LAB_001d931f:
              fts5StorageInsert(&local_88,(Fts5FullTable *)pVtab,apVal,pRowid);
            }
            else {
              local_88 = sqlite3Fts5StorageFindDeleteRow(pFVar5,iVar15);
              if (local_88 == 0) {
                local_88 = sqlite3Fts5StorageContentInsert(pFVar5,1,apVal,pRowid);
              }
            }
          }
          else {
            if (bVar24) {
              local_88 = sqlite3Fts5StorageDelete(pFVar5,iVar15,(sqlite3_value **)0x0,1);
              if (local_88 == 0) {
                local_88 = sqlite3Fts5StorageDelete(pFVar5,iVar19,(sqlite3_value **)0x0,0);
              }
              goto LAB_001d931f;
            }
            local_88 = sqlite3Fts5StorageFindDeleteRow(pFVar5,iVar15);
            if (((local_88 == 0) &&
                (local_88 = sqlite3Fts5StorageContentInsert(pFVar5,0,apVal,pRowid), local_88 == 0))
               && (local_88 = sqlite3Fts5StorageDelete(pFVar5,iVar15,(sqlite3_value **)0x0,0),
                  local_88 == 0)) {
              local_88 = sqlite3Fts5StorageIndexInsert(pFVar5,apVal,*pRowid);
            }
          }
        }
        else {
          local_88 = 0x14;
        }
        sqlite3_reset(pFVar5->pSavedRow);
        pFVar5->pSavedRow = (sqlite3_stmt *)0x0;
        iVar7 = local_88;
      }
    }
  }
  else {
    pcVar10 = (char *)sqlite3ValueText(psVar16,'\x01');
    if (pFVar4->eContent == 0) {
LAB_001d906a:
      pMVar14 = apVal[(long)pFVar4->nCol + 3];
      local_84 = 0;
      if (pcVar10 != (char *)0x0) {
        lVar11 = 0;
        do {
          bVar2 = "delete-all"[lVar11];
          if (bVar2 == pcVar10[lVar11]) {
            if ((ulong)bVar2 == 0) goto LAB_001d91ea;
          }
          else if (""[bVar2] != ""[(byte)pcVar10[lVar11]]) {
            lVar11 = 0;
            goto LAB_001d922c;
          }
          lVar11 = lVar11 + 1;
        } while( true );
      }
    }
    else {
      if (pcVar10 != (char *)0x0) {
        lVar11 = 0;
        do {
          bVar2 = "secure-delete"[lVar11 + 7];
          if (bVar2 == pcVar10[lVar11]) {
            if ((ulong)bVar2 == 0) goto LAB_001d91aa;
          }
          else if (""[bVar2] != ""[(byte)pcVar10[lVar11]]) goto LAB_001d906a;
          lVar11 = lVar11 + 1;
        } while( true );
      }
      pMVar14 = apVal[(long)pFVar4->nCol + 3];
    }
LAB_001d912e:
    local_84 = 0;
    iVar7 = sqlite3Fts5FlushToDisk((Fts5Table *)pVtab);
    if (iVar7 == 0) {
      pFVar23 = *(Fts5Index **)&pVtab[1].nRef;
      pFVar12 = fts5StructureRead(pFVar23);
      fts5StructureRelease(pFVar12);
      iVar7 = pFVar23->rc;
      pFVar23->rc = 0;
      if (((iVar7 == 0) &&
          (iVar7 = sqlite3Fts5ConfigSetValue
                             ((Fts5Config *)pVtab[1].pModule,pcVar10,pMVar14,&local_84), iVar7 == 0)
          ) && (iVar7 = 1, local_84 == 0)) {
        iVar7 = sqlite3Fts5StorageConfigValue((Fts5Storage *)pVtab[1].zErrMsg,pcVar10,pMVar14,0);
      }
    }
  }
  goto LAB_001d940c;
LAB_001d922c:
  bVar2 = "rebuild"[lVar11];
  if (bVar2 == pcVar10[lVar11]) {
    if ((ulong)bVar2 == 0) goto LAB_001d9329;
  }
  else if (""[bVar2] != ""[(byte)pcVar10[lVar11]]) {
    lVar11 = 0;
    goto LAB_001d934d;
  }
  lVar11 = lVar11 + 1;
  goto LAB_001d922c;
LAB_001d934d:
  bVar2 = "optimize"[lVar11];
  if (bVar2 == pcVar10[lVar11]) {
    if ((ulong)bVar2 == 0) goto LAB_001d9495;
  }
  else if (""[bVar2] != ""[(byte)pcVar10[lVar11]]) {
    lVar11 = 0;
    goto LAB_001d956d;
  }
  lVar11 = lVar11 + 1;
  goto LAB_001d934d;
LAB_001d956d:
  bVar2 = "deletemerge"[lVar11 + 6];
  if (bVar2 == pcVar10[lVar11]) {
    if ((ulong)bVar2 == 0) goto LAB_001d9595;
  }
  else if (""[bVar2] != ""[(byte)pcVar10[lVar11]]) {
    lVar11 = 0;
    goto LAB_001d9668;
  }
  lVar11 = lVar11 + 1;
  goto LAB_001d956d;
LAB_001d9668:
  bVar2 = "integrity-check"[lVar11];
  if (bVar2 == pcVar10[lVar11]) {
    if ((ulong)bVar2 == 0) goto LAB_001d96d3;
  }
  else if (""[bVar2] != ""[(byte)pcVar10[lVar11]]) {
    lVar11 = 0;
    goto LAB_001d96f4;
  }
  lVar11 = lVar11 + 1;
  goto LAB_001d9668;
LAB_001d96f4:
  bVar2 = "flush"[lVar11];
  if (bVar2 == pcVar10[lVar11]) {
    if ((ulong)bVar2 == 0) goto LAB_001d974e;
  }
  else if (""[bVar2] != ""[(byte)pcVar10[lVar11]]) goto LAB_001d912e;
  lVar11 = lVar11 + 1;
  goto LAB_001d96f4;
LAB_001d974e:
  iVar7 = sqlite3Fts5FlushToDisk((Fts5Table *)pVtab);
  goto LAB_001d940c;
LAB_001d96d3:
  iVar15 = sqlite3VdbeIntValue(pMVar14);
  iVar7 = sqlite3Fts5StorageIntegrity((Fts5Storage *)pVtab[1].zErrMsg,(int)iVar15);
  goto LAB_001d940c;
LAB_001d9595:
  iVar15 = sqlite3VdbeIntValue(pMVar14);
  iVar7 = (int)iVar15;
  pFVar23 = *(Fts5Index **)(pVtab[1].zErrMsg + 8);
  fts5IndexFlush(pFVar23);
  pFVar12 = fts5StructureRead(pFVar23);
  local_48.p = (u8 *)pFVar12;
  if (pFVar12 != (Fts5Structure *)0x0) {
    iVar8 = pFVar23->pConfig->nUsermerge;
    if (pFVar23->pStruct != (Fts5Structure *)0x0) {
      fts5StructureRelease(pFVar23->pStruct);
      pFVar23->pStruct = (Fts5Structure *)0x0;
    }
    if (iVar7 < 0) {
      pFVar13 = fts5IndexOptimizeStruct(pFVar23,pFVar12);
      fts5StructureRelease(pFVar12);
      local_48.p = (u8 *)pFVar13;
      if (pFVar13 == (Fts5Structure *)0x0) {
        pFVar12 = (Fts5Structure *)0x0;
        goto LAB_001d998f;
      }
      iVar7 = -iVar7;
      iVar8 = 1;
      pFVar12 = pFVar13;
    }
    if ((pFVar12->nLevel != 0) &&
       (iVar7 = fts5IndexMerge(pFVar23,(Fts5Structure **)&local_48,iVar7,iVar8),
       pFVar12 = (Fts5Structure *)local_48.p, iVar7 != 0)) {
      fts5StructureWrite(pFVar23,(Fts5Structure *)local_48.p);
    }
    goto LAB_001d998f;
  }
  goto LAB_001d9994;
LAB_001d9329:
  if (((ulong)(pVtab[1].pModule)->xNext & 0xfffffffd) == 1) {
    pcVar10 = "\'rebuild\' may not be used with a contentless fts5 table";
    goto LAB_001d9449;
  }
  pFVar5 = (Fts5Storage *)pVtab[1].zErrMsg;
  local_48.p = (u8 *)0x0;
  local_48.n = 0;
  local_48.nSpace = 0;
  pFVar4 = pFVar5->pConfig;
  local_50 = (sqlite3_stmt *)0x0;
  local_58 = 0;
  local_60 = pFVar5;
  iVar8 = sqlite3Fts5StorageDeleteAll(pFVar5);
  if ((iVar8 == 0) && (iVar8 = fts5StorageLoadTotals(pFVar5,1), iVar8 == 0)) {
    iVar8 = fts5StorageGetStmt(pFVar5,0xb,&local_50,pFVar4->pzErrmsg);
    pStmt = local_50;
    if (iVar8 != 0) goto LAB_001d96a5;
    do {
      iVar7 = sqlite3_step(pStmt);
      bVar24 = iVar7 != 100;
      if (bVar24) {
        bVar24 = true;
        pFVar12 = (Fts5Structure *)local_48.p;
        iVar8 = 0;
        break;
      }
      pMVar14 = columnMem(pStmt,0);
      iVar15 = sqlite3VdbeIntValue(pMVar14);
      columnMallocFailure(pStmt);
      local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
      local_64 = sqlite3Fts5IndexBeginWrite(pFVar5->pIndex,0,iVar15);
      local_58 = local_58 & 0xffffffff00000000;
      if (local_64 != 0) {
LAB_001d99a7:
        pFVar5->nTotalRow = pFVar5->nTotalRow + 1;
        bVar24 = false;
        pFVar12 = (Fts5Structure *)local_48.p;
        iVar8 = local_64;
        break;
      }
      iVar7 = 0;
      while (iVar7 < pFVar4->nCol) {
        local_58 = local_58 & 0xffffffff;
        if (pFVar4->abUnindexed[iVar7] == '\0') {
          local_68 = 0;
          local_70 = (char *)0x0;
          local_74 = 0;
          local_80 = (uchar *)0x0;
          psVar16 = sqlite3_column_value(pStmt,iVar7 + 1);
          if ((pFVar4->eContent == 2) &&
             (iVar7 = sqlite3Fts5IsLocaleValue(pFVar4,psVar16), iVar7 != 0)) {
            local_64 = sqlite3Fts5DecodeLocaleValue
                                 (psVar16,&local_70,&local_68,(char **)&local_80,&local_74);
            pcVar10 = local_70;
            puVar17 = local_80;
            iVar8 = local_74;
            iVar7 = local_68;
            if (local_64 == 0) goto LAB_001d98b9;
          }
          else {
            pcVar10 = (char *)sqlite3ValueText(psVar16,'\x01');
            local_70 = pcVar10;
            iVar7 = sqlite3ValueBytes(psVar16,'\x01');
            local_68 = iVar7;
            if (pFVar4->bLocale == 0) {
              puVar17 = (uchar *)0x0;
              iVar8 = 0;
            }
            else {
              iVar8 = (int)local_58 + pFVar4->nCol + 1;
              puVar17 = sqlite3_column_text(pStmt,iVar8);
              local_80 = puVar17;
              local_74 = sqlite3_column_bytes(pStmt,iVar8);
              iVar8 = local_74;
            }
LAB_001d98b9:
            (pFVar4->t).pLocale = (char *)puVar17;
            (pFVar4->t).nLocale = iVar8;
            local_64 = sqlite3Fts5Tokenize(pFVar4,4,pcVar10,iVar7,&local_60,
                                           fts5StorageInsertCallback);
            (pFVar4->t).pLocale = (char *)0x0;
            (pFVar4->t).nLocale = 0;
          }
          iVar19 = (i64)local_58._4_4_;
        }
        else {
          iVar19 = 0;
        }
        sqlite3Fts5BufferAppendVarint(&local_64,&local_48,iVar19);
        pFVar5->aTotalSize[(int)local_58] = pFVar5->aTotalSize[(int)local_58] + (long)local_58._4_4_
        ;
        iVar7 = (int)local_58 + 1;
        local_58 = CONCAT44(local_58._4_4_,iVar7);
        if (local_64 != 0) goto LAB_001d99a7;
      }
      pFVar5->nTotalRow = pFVar5->nTotalRow + 1;
      iVar8 = fts5StorageInsertDocsize(pFVar5,iVar15,&local_48);
      pFVar12 = (Fts5Structure *)local_48.p;
      local_64 = iVar8;
    } while (iVar8 == 0);
  }
  else {
    pStmt = (sqlite3_stmt *)0x0;
LAB_001d96a5:
    bVar24 = false;
    pFVar12 = (Fts5Structure *)0x0;
  }
  sqlite3_free(pFVar12);
  iVar7 = sqlite3_reset(pStmt);
  if (!bVar24) {
    iVar7 = iVar8;
  }
  if (iVar7 == 0) {
    iVar7 = fts5StorageSaveTotals(pFVar5);
  }
LAB_001d91fd:
  if (iVar7 == 0) {
    pp_Var1 = &(pVtab[1].pModule)->xIntegrity;
    *(int *)pp_Var1 = *(int *)pp_Var1 + -1;
    pFVar23 = *(Fts5Index **)&pVtab[1].nRef;
    pFVar12 = fts5StructureRead(pFVar23);
LAB_001d998f:
    fts5StructureRelease(pFVar12);
    goto LAB_001d9994;
  }
  goto LAB_001d940c;
LAB_001d91ea:
  if (*(int *)&(pVtab[1].pModule)->xNext != 0) {
    iVar7 = sqlite3Fts5StorageDeleteAll((Fts5Storage *)pVtab[1].zErrMsg);
    goto LAB_001d91fd;
  }
  pcVar10 = "\'delete-all\' may only be used with a contentless or external content fts5 table";
LAB_001d9449:
  fts5SetVtabError((Fts5FullTable *)pVtab,pcVar10);
  iVar7 = 1;
  goto LAB_001d940c;
LAB_001d91aa:
  if (pFVar4->bContentlessDelete == 0) {
    iVar7 = fts5SpecialDelete((Fts5FullTable *)pVtab,apVal);
  }
  else {
    fts5SetVtabError((Fts5FullTable *)pVtab,
                     "\'delete\' may not be used with a contentless_delete=1 table");
LAB_001d9281:
    local_88 = 1;
    iVar7 = local_88;
  }
  goto LAB_001d940c;
LAB_001d9495:
  pFVar23 = *(Fts5Index **)(pVtab[1].zErrMsg + 8);
  fts5IndexFlush(pFVar23);
  pFVar13 = fts5StructureRead(pFVar23);
  if (pFVar23->pStruct != (Fts5Structure *)0x0) {
    fts5StructureRelease(pFVar23->pStruct);
    pFVar23->pStruct = (Fts5Structure *)0x0;
  }
  if (pFVar13 != (Fts5Structure *)0x0) {
    pFVar12 = fts5IndexOptimizeStruct(pFVar23,pFVar13);
    local_48.p = (u8 *)pFVar12;
    fts5StructureRelease(pFVar13);
    if (pFVar12 != (Fts5Structure *)0x0) {
      iVar7 = -1;
      lVar11 = 0x24;
      do {
        lVar21 = lVar11;
        iVar7 = iVar7 + 1;
        lVar11 = lVar21 + 0x10;
      } while (*(int *)((long)&((Fts5Structure *)(pFVar12->aLevel + -2))->nRef + lVar21) == 0);
      if (pFVar23->rc == 0) {
        do {
          pFVar12 = (Fts5Structure *)local_48.p;
          if (*(int *)((long)&((Fts5Structure *)
                              ((Fts5StructureLevel *)((long)local_48.p + 0x20) + -2))->nRef + lVar21
                      ) < 1) break;
          local_60 = (Fts5Storage *)CONCAT44(local_60._4_4_,1000);
          fts5IndexMergeLevel(pFVar23,(Fts5Structure **)&local_48,iVar7,(int *)&local_60);
          pFVar12 = (Fts5Structure *)local_48.p;
        } while (pFVar23->rc == 0);
      }
      fts5StructureWrite(pFVar23,pFVar12);
      goto LAB_001d998f;
    }
  }
LAB_001d9994:
  iVar7 = pFVar23->rc;
  pFVar23->rc = 0;
LAB_001d940c:
  local_88 = iVar7;
  pVtab[1].pModule[1].xOpen = (_func_int_sqlite3_vtab_ptr_sqlite3_vtab_cursor_ptr_ptr *)0x0;
LAB_001d941f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_88;
}

Assistant:

static int fts5UpdateMethod(
  sqlite3_vtab *pVtab,            /* Virtual table handle */
  int nArg,                       /* Size of argument array */
  sqlite3_value **apVal,          /* Array of arguments */
  sqlite_int64 *pRowid            /* OUT: The affected (or effected) rowid */
){
  Fts5FullTable *pTab = (Fts5FullTable*)pVtab;
  Fts5Config *pConfig = pTab->p.pConfig;
  int eType0;                     /* value_type() of apVal[0] */
  int rc = SQLITE_OK;             /* Return code */

  /* A transaction must be open when this is called. */
  assert( pTab->ts.eState==1 || pTab->ts.eState==2 );

  assert( pVtab->zErrMsg==0 );
  assert( nArg==1 || nArg==(2+pConfig->nCol+2) );
  assert( sqlite3_value_type(apVal[0])==SQLITE_INTEGER
       || sqlite3_value_type(apVal[0])==SQLITE_NULL
  );
  assert( pTab->p.pConfig->pzErrmsg==0 );
  if( pConfig->pgsz==0 ){
    rc = sqlite3Fts5ConfigLoad(pTab->p.pConfig, pTab->p.pConfig->iCookie);
    if( rc!=SQLITE_OK ) return rc;
  }

  pTab->p.pConfig->pzErrmsg = &pTab->p.base.zErrMsg;

  /* Put any active cursors into REQUIRE_SEEK state. */
  fts5TripCursors(pTab);

  eType0 = sqlite3_value_type(apVal[0]);
  if( eType0==SQLITE_NULL
   && sqlite3_value_type(apVal[2+pConfig->nCol])!=SQLITE_NULL
  ){
    /* A "special" INSERT op. These are handled separately. */
    const char *z = (const char*)sqlite3_value_text(apVal[2+pConfig->nCol]);
    if( pConfig->eContent!=FTS5_CONTENT_NORMAL
      && 0==sqlite3_stricmp("delete", z)
    ){
      if( pConfig->bContentlessDelete ){
        fts5SetVtabError(pTab,
            "'delete' may not be used with a contentless_delete=1 table"
        );
        rc = SQLITE_ERROR;
      }else{
        rc = fts5SpecialDelete(pTab, apVal);
      }
    }else{
      rc = fts5SpecialInsert(pTab, z, apVal[2 + pConfig->nCol + 1]);
    }
  }else{
    /* A regular INSERT, UPDATE or DELETE statement. The trick here is that
    ** any conflict on the rowid value must be detected before any
    ** modifications are made to the database file. There are 4 cases:
    **
    **   1) DELETE
    **   2) UPDATE (rowid not modified)
    **   3) UPDATE (rowid modified)
    **   4) INSERT
    **
    ** Cases 3 and 4 may violate the rowid constraint.
    */
    int eConflict = SQLITE_ABORT;
    if( pConfig->eContent==FTS5_CONTENT_NORMAL || pConfig->bContentlessDelete ){
      eConflict = sqlite3_vtab_on_conflict(pConfig->db);
    }

    assert( eType0==SQLITE_INTEGER || eType0==SQLITE_NULL );
    assert( nArg!=1 || eType0==SQLITE_INTEGER );

    /* DELETE */
    if( nArg==1 ){
      /* It is only possible to DELETE from a contentless table if the
      ** contentless_delete=1 flag is set. */
      if( fts5IsContentless(pTab, 1) && pConfig->bContentlessDelete==0 ){
        fts5SetVtabError(pTab,
            "cannot DELETE from contentless fts5 table: %s", pConfig->zName
        );
        rc = SQLITE_ERROR;
      }else{
        i64 iDel = sqlite3_value_int64(apVal[0]);  /* Rowid to delete */
        rc = sqlite3Fts5StorageDelete(pTab->pStorage, iDel, 0, 0);
      }
    }

    /* INSERT or UPDATE */
    else{
      int eType1 = sqlite3_value_numeric_type(apVal[1]);

      /* It is an error to write an fts5_locale() value to a table without
      ** the locale=1 option. */
      if( pConfig->bLocale==0 ){
        int ii;
        for(ii=0; ii<pConfig->nCol; ii++){
          sqlite3_value *pVal = apVal[ii+2];
          if( sqlite3Fts5IsLocaleValue(pConfig, pVal) ){
            fts5SetVtabError(pTab, "fts5_locale() requires locale=1");
            rc = SQLITE_MISMATCH;
            goto update_out;
          }
        }
      }

      if( eType0!=SQLITE_INTEGER ){
        /* An INSERT statement. If the conflict-mode is REPLACE, first remove
        ** the current entry (if any). */
        if( eConflict==SQLITE_REPLACE && eType1==SQLITE_INTEGER ){
          i64 iNew = sqlite3_value_int64(apVal[1]);  /* Rowid to delete */
          rc = sqlite3Fts5StorageDelete(pTab->pStorage, iNew, 0, 0);
        }
        fts5StorageInsert(&rc, pTab, apVal, pRowid);
      }

      /* UPDATE */
      else{
        Fts5Storage *pStorage = pTab->pStorage;
        i64 iOld = sqlite3_value_int64(apVal[0]);  /* Old rowid */
        i64 iNew = sqlite3_value_int64(apVal[1]);  /* New rowid */
        int bContent = 0;         /* Content only update */

        /* If this is a contentless table (including contentless_unindexed=1
        ** tables), check if the UPDATE may proceed.  */
        if( fts5IsContentless(pTab, 1) ){
          rc = fts5ContentlessUpdate(pConfig, &apVal[2], iOld!=iNew, &bContent);
          if( rc!=SQLITE_OK ) goto update_out;
        }

        if( eType1!=SQLITE_INTEGER ){
          rc = SQLITE_MISMATCH;
        }else if( iOld!=iNew ){
          assert( bContent==0 );
          if( eConflict==SQLITE_REPLACE ){
            rc = sqlite3Fts5StorageDelete(pStorage, iOld, 0, 1);
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageDelete(pStorage, iNew, 0, 0);
            }
            fts5StorageInsert(&rc, pTab, apVal, pRowid);
          }else{
            rc = sqlite3Fts5StorageFindDeleteRow(pStorage, iOld);
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageContentInsert(pStorage, 0, apVal, pRowid);
            }
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageDelete(pStorage, iOld, 0, 0);
            }
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageIndexInsert(pStorage, apVal, *pRowid);
            }
          }
        }else if( bContent ){
          /* This occurs when an UPDATE on a contentless table affects *only*
          ** UNINDEXED columns. This is a no-op for contentless_unindexed=0
          ** tables, or a write to the %_content table only for =1 tables.  */
          assert( fts5IsContentless(pTab, 1) );
          rc = sqlite3Fts5StorageFindDeleteRow(pStorage, iOld);
          if( rc==SQLITE_OK ){
            rc = sqlite3Fts5StorageContentInsert(pStorage, 1, apVal, pRowid);
          }
        }else{
          rc = sqlite3Fts5StorageDelete(pStorage, iOld, 0, 1);
          fts5StorageInsert(&rc, pTab, apVal, pRowid);
        }
        sqlite3Fts5StorageReleaseDeleteRow(pStorage);
      }
    }
  }

 update_out:
  pTab->p.pConfig->pzErrmsg = 0;
  return rc;
}